

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_backup_swap(int p)

{
  int iVar1;
  wchar_t wVar2;
  borg_item_conflict *pbVar3;
  char *what;
  int local_4c;
  _Bool fix;
  borg_item_conflict *item;
  int local_30;
  int save_fract;
  int save_rblind;
  int save_rconf;
  int i;
  int32_t b_p2;
  int32_t b_p1;
  int32_t b_p;
  int swap;
  int slot;
  int p_local;
  
  i = 0;
  save_rconf = 0;
  save_fract = 0;
  local_30 = 0;
  item._4_4_ = 0;
  if ((((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) && (borg.time_this_panel < 0x12d)) &&
     ((armour_swap != 0 || (weapon_swap != 0)))) {
    if (armour_swap != 0) {
      save_fract = borg.trait[0x4e];
      local_30 = borg.trait[0x4d];
      item._4_4_ = borg.trait[0x56];
      save_rblind = armour_swap + -1;
      if (save_rblind == -1) {
        save_rblind = 0;
      }
      pbVar3 = borg_items + save_rblind;
      wVar2 = borg_wield_slot(pbVar3);
      if (wVar2 < L'\0') {
        return false;
      }
      memcpy(borg_items + wVar2,safe_items + save_rblind,0x388);
      borg_items[wVar2].iqty = '\x01';
      borg_items[save_rblind].iqty = borg_items[save_rblind].iqty + 0xff;
      borg_notice(false);
      i = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      memcpy(borg_items + wVar2,safe_items + wVar2,0x388);
      memcpy(borg_items + save_rblind,safe_items + save_rblind,0x388);
      if ((save_fract != 0) && (borg.trait[0x4e] == 0)) {
        i = 9999;
      }
      if ((((local_30 != 0) && (borg.trait[0x4d] == 0)) && (borg.trait[0x4b] == 0)) &&
         ((borg.trait[0x4c] == 0 && (borg.trait[0x39] < 100)))) {
        i = 9999;
      }
      if (((item._4_4_ != 0) && (borg.trait[0x56] == 0)) && (borg.trait[0x39] < 100)) {
        i = 9999;
      }
      borg_notice(true);
      if (((((player->opts).opt[0x1e] & 1U) != 0) && (pbVar3->art_idx != '\0')) &&
         ((pbVar3->ident & 1U) == 0)) {
        i = 9999;
      }
      if (((pbVar3->cursed & 1U) != 0) && ((pbVar3->uncursable & 1U) == 0)) {
        i = 9999;
      }
    }
    if (weapon_swap != 0) {
      save_rblind = weapon_swap + -1;
      if (save_rblind == -1) {
        save_rblind = 0;
      }
      pbVar3 = borg_items + save_rblind;
      wVar2 = borg_wield_slot(pbVar3);
      if (wVar2 < L'\0') {
        return false;
      }
      memcpy(borg_items + wVar2,safe_items + save_rblind,0x388);
      borg_items[wVar2].iqty = '\x01';
      borg_items[save_rblind].iqty = borg_items[save_rblind].iqty + 0xff;
      borg_notice(false);
      save_rconf = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      if ((save_fract != 0) && (borg.trait[0x4e] == 0)) {
        save_rconf = 9999;
      }
      if ((((local_30 != 0) && (borg.trait[0x4d] == 0)) && (borg.trait[0x4b] == 0)) &&
         ((borg.trait[0x4c] == 0 && (borg.trait[0x39] < 100)))) {
        save_rconf = 9999;
      }
      if (((item._4_4_ != 0) && (borg.trait[0x56] == 0)) && (borg.trait[0x39] < 100)) {
        save_rconf = 9999;
      }
      memcpy(borg_items + wVar2,safe_items + wVar2,0x388);
      memcpy(borg_items + save_rblind,safe_items + save_rblind,0x388);
      borg_notice(true);
      if (((((player->opts).opt[0x1e] & 1U) != 0) && (pbVar3->art_idx != '\0')) &&
         ((pbVar3->ident & 1U) == 0)) {
        save_rconf = 9999;
      }
      if (((pbVar3->cursed & 1U) != 0) && ((pbVar3->uncursable & 1U) == 0)) {
        save_rconf = 9999;
      }
    }
    if (save_rconf < i) {
      b_p2 = i;
      iVar1 = armour_swap;
    }
    else {
      b_p2 = save_rconf;
      iVar1 = weapon_swap;
    }
    b_p1 = iVar1 + -1;
    if (b_p2 < p) {
      if (borg_fighting_unique == L'\0') {
        local_4c = (int)avoidance / 2;
      }
      else {
        local_4c = ((int)avoidance << 1) / 3;
      }
      if (b_p2 <= local_4c) {
        what = format("# Swapping backup.  (%ld < %d).",(long)b_p2,(ulong)(uint)p);
        borg_note(what);
        borg_keypress(0x77);
        borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[b_p1]);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_backup_swap(int p)
{
    int slot;
    int swap;

    int32_t b_p  = 0L;
    int32_t b_p1 = 0L;
    int32_t b_p2 = 0L;

    int i;

    int save_rconf  = 0;
    int save_rblind = 0;
    int save_fract  = 0;

    borg_item *item;

    bool fix = false;

    /* hack prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg.time_this_panel > 300)
        return false;

    /* make sure we have an appropriate swap */
    if (!armour_swap && !weapon_swap)
        return false;

    if (armour_swap) {
        /* Save our normal condition */
        save_rconf  = borg.trait[BI_RCONF];
        save_rblind = borg.trait[BI_RBLIND];
        save_fract  = borg.trait[BI_FRACT];

        /* Check the items, first armour then weapon */
        i = armour_swap - 1;

        /* make sure it is not a -1 */
        if (i == -1)
            i = 0;

        /* get the item */
        item = &borg_items[i];

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* safety check incase slot = -1 */
        if (slot < 0)
            return false;

        /* Wear new item */
        memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

        /* Only a single item */
        borg_items[slot].iqty = 1;

        /* Reduce the inventory quantity by one */
        borg_items[i].iqty--;

        /* Fix later */
        fix = true;

        /* Examine the benefits of the swap item */
        borg_notice(false);

        /* Evaluate the power with the new item worn */
        b_p1 = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* Restore the old item */
        memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

        /* Restore the new item */
        memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

        /* Examine the critical skills */
        if ((save_rconf) && borg.trait[BI_RCONF] == 0)
            b_p1 = 9999;
        if ((save_rblind)
            && (!borg.trait[BI_RBLIND] && !borg.trait[BI_RLITE]
                && !borg.trait[BI_RDARK] && borg.trait[BI_SAV] < 100))
            b_p1 = 9999;
        if ((save_fract) && (!borg.trait[BI_FRACT] && borg.trait[BI_SAV] < 100))
            b_p1 = 9999;

        /* Restore bonuses */
        if (fix)
            borg_notice(true);

        /*  skip random artifact not star id'd  */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            b_p1 = 9999;

        /* skip it if it has not been decursed */
        if (item->cursed && !item->uncursable)
            b_p1 = 9999;
    }

    /* Now we check the weapon */
    if (weapon_swap) {
        /* get the item */
        i = weapon_swap - 1;

        /* make sure it is not a -1 */
        if (i == -1)
            i = 0;

        item = &borg_items[i];

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* safety check incase slot = -1 */
        if (slot < 0)
            return false;

        /* Wear new item */
        memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

        /* Only a single item */
        borg_items[slot].iqty = 1;

        /* Reduce the inventory quantity by one */
        borg_items[i].iqty--;

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(false);

        /* Evaluate the power with the new item worn */
        b_p2 = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* Examine the critical skills */
        /* Examine the critical skills */
        if ((save_rconf) && borg.trait[BI_RCONF] == 0)
            b_p2 = 9999;
        if ((save_rblind)
            && (!borg.trait[BI_RBLIND] && !borg.trait[BI_RLITE]
                && !borg.trait[BI_RDARK] && borg.trait[BI_SAV] < 100))
            b_p2 = 9999;
        if ((save_fract) && (!borg.trait[BI_FRACT] && borg.trait[BI_SAV] < 100))
            b_p2 = 9999;

        /* Restore the old item (empty) */
        memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

        /* Restore the new item */
        memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

        /* Restore bonuses */
        if (fix)
            borg_notice(true);

        /*  skip random artifact not star id'd  */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            b_p2 = 9999;

        /* skip it if it has not been decursed */
        if (item->cursed && !item->uncursable)
            b_p2 = 9999;
    }

    /* Pass on the swap which yields the best result */
    if (b_p1 <= b_p2) {
        b_p  = b_p2;
        swap = weapon_swap - 1;
    } else {
        b_p  = b_p1;
        swap = armour_swap - 1;
    }

    /* good swap.  Make sure it helps a significant amount */
    if (p > b_p
        && b_p <= (borg_fighting_unique ? ((avoidance * 2) / 3)
                                        : (avoidance / 2))) {
        /* Log */
        borg_note(format("# Swapping backup.  (%ld < %d).", (long int)b_p, p));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[swap]);

        /* Did something */
        return true;
    }

    /* Nope */
    return false;
}